

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_artifact_time(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  object_kind *poVar3;
  random_conflict rVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar3 = lookup_kind(*(wchar_t *)((long)pvVar2 + 0x20),*(wchar_t *)((long)pvVar2 + 0x24));
    if ((*(int *)((long)pvVar2 + 0x20) == 0x13) && ((uint)z_info->ordinary_kind_max <= poVar3->kidx)
       ) {
      rVar4 = parser_getrand(p,"time");
      (poVar3->time).base = rVar4.base;
      (poVar3->time).dice = rVar4.dice;
      (poVar3->time).sides = rVar4.sides;
      (poVar3->time).m_bonus = rVar4.m_bonus;
    }
    else {
      rVar4 = parser_getrand(p,"time");
      *(random_conflict *)((long)pvVar2 + 0x130) = rVar4;
    }
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_artifact_time(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Special light activations are a property of the base object */
	k = lookup_kind(a->tval, a->sval);
	if ((a->tval == TV_LIGHT) && (k->kidx >= z_info->ordinary_kind_max)) {
		k->time = parser_getrand(p, "time");
	} else {
		a->time = parser_getrand(p, "time");
	}
	return PARSE_ERROR_NONE;
}